

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode ossl_connect(Curl_cfilter *cf,Curl_easy *data)

{
  _Bool local_25 [5];
  _Bool done;
  Curl_easy *pCStack_20;
  CURLcode result;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  local_25[0] = false;
  pCStack_20 = data;
  data_local = (Curl_easy *)cf;
  cf_local._4_4_ = ossl_connect_common(cf,data,false,local_25);
  if (cf_local._4_4_ == CURLE_OK) {
    cf_local._4_4_ = CURLE_OK;
  }
  return cf_local._4_4_;
}

Assistant:

static CURLcode ossl_connect(struct Curl_cfilter *cf,
                             struct Curl_easy *data)
{
  CURLcode result;
  bool done = FALSE;

  result = ossl_connect_common(cf, data, FALSE, &done);
  if(result)
    return result;

  DEBUGASSERT(done);

  return CURLE_OK;
}